

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeMemberAccess(ExpressionContext *ctx,SynMemberAccess *syntax)

{
  bool bVar1;
  TypeBase *pTVar2;
  ExprBase *value_00;
  ExprBase *value;
  ExprBase *result;
  TypeBase *type_1;
  TypeBase *type;
  SynMemberAccess *syntax_local;
  ExpressionContext *ctx_local;
  
  pTVar2 = AnalyzeType(ctx,&syntax->super_SynBase,false,(bool *)0x0);
  if (pTVar2 == (TypeBase *)0x0) {
    pTVar2 = AnalyzeType(ctx,syntax->value,false,(bool *)0x0);
    if ((pTVar2 == (TypeBase *)0x0) ||
       (ctx_local = (ExpressionContext *)
                    CreateTypeidMemberAccess(ctx,&syntax->super_SynBase,pTVar2,syntax->member),
       ctx_local == (ExpressionContext *)0x0)) {
      value_00 = AnalyzeExpression(ctx,syntax->value);
      bVar1 = isType<TypeError>(value_00->type);
      if (bVar1) {
        ctx_local = (ExpressionContext *)ExpressionContext::get<ExprMemberAccess>(ctx);
        pTVar2 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        ExprMemberAccess::ExprMemberAccess
                  ((ExprMemberAccess *)ctx_local,&syntax->super_SynBase,pTVar2,value_00,
                   (VariableHandle *)0x0);
      }
      else {
        ctx_local = (ExpressionContext *)
                    CreateMemberAccess(ctx,&syntax->super_SynBase,value_00,syntax->member,false);
      }
    }
  }
  else {
    if (pTVar2 == ctx->typeAuto) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&syntax->super_SynBase,"ERROR: cannot take typeid from auto type");
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprTypeLiteral>(ctx);
    ExprTypeLiteral::ExprTypeLiteral
              ((ExprTypeLiteral *)ctx_local,&syntax->super_SynBase,ctx->typeTypeID,pTVar2);
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeMemberAccess(ExpressionContext &ctx, SynMemberAccess *syntax)
{
	// It could be a typeid
	if(TypeBase *type = AnalyzeType(ctx, syntax, false))
	{
		if(type == ctx.typeAuto)
			Stop(ctx, syntax, "ERROR: cannot take typeid from auto type");

		return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(syntax, ctx.typeTypeID, type);
	}

	// It could be a type property
	if(TypeBase *type = AnalyzeType(ctx, syntax->value, false))
	{
		if(ExprBase *result = CreateTypeidMemberAccess(ctx, syntax, type, syntax->member))
			return result;
	}

	ExprBase* value = AnalyzeExpression(ctx, syntax->value);

	if(isType<TypeError>(value->type))
		return new (ctx.get<ExprMemberAccess>()) ExprMemberAccess(syntax, ctx.GetErrorType(), value, NULL);

	return CreateMemberAccess(ctx, syntax, value, syntax->member, false);
}